

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::deinit(MultiVertexArrayObjectTest *this)

{
  GLuint *buffers;
  pointer puVar1;
  ShaderProgram *pSVar2;
  GLenum err;
  
  buffers = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  glwDeleteBuffers((GLsizei)((ulong)((long)(this->m_buffers).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)buffers) >> 2),buffers);
  err = glwGetError();
  glu::checkError(err,"glDeleteBuffers((GLsizei)m_buffers.size(), &(m_buffers[0]))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x344);
  puVar1 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pSVar2 = this->m_vaoProgram;
  if (pSVar2 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar2);
  }
  operator_delete(pSVar2,0xd0);
  pSVar2 = this->m_stateProgram;
  if (pSVar2 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar2);
  }
  operator_delete(pSVar2,0xd0);
  if (this->m_indices != (deUint8 *)0x0) {
    operator_delete__(this->m_indices);
    return;
  }
  return;
}

Assistant:

void MultiVertexArrayObjectTest::deinit (void)
{
	GLU_CHECK_CALL(glDeleteBuffers((GLsizei)m_buffers.size(), &(m_buffers[0])));
	m_buffers.clear();
	delete m_vaoProgram;
	delete m_stateProgram;
	delete[] m_indices;
}